

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall
glslang::TType::TType
          (TType *this,TBasicType t,TStorageQualifier q,TPrecisionQualifier p,int vs,int mc,int mr,
          bool isVector)

{
  uint uVar1;
  bool bVar2;
  bool local_39;
  bool local_26;
  bool isVector_local;
  int mc_local;
  int vs_local;
  TPrecisionQualifier p_local;
  TStorageQualifier q_local;
  TBasicType t_local;
  TType *this_local;
  
  this->_vptr_TType = (_func_int **)&PTR__TType_010d8758;
  *(TBasicType *)&this->field_0x8 = *(TBasicType *)&this->field_0x8 & 0xffffff00 | t & 0xff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfffff0ff | (vs & 0xfU) << 8;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffff0fff | (mc & 0xfU) << 0xc;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfff0ffff | (mr & 0xfU) << 0x10;
  local_26 = isVector && vs == 1;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffefffff | (uint)local_26 << 0x14;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffdfffff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xffbfffff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfc7fffff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xfbffffff;
  *(uint *)&this->field_0x8 = *(uint *)&this->field_0x8 & 0xf7ffffff;
  this->arraySizes = (TArraySizes *)0x0;
  (this->field_13).structure = (TTypeList *)0x0;
  this->fieldName = (TString *)0x0;
  this->typeName = (TString *)0x0;
  this->typeParameters = (TTypeParameters *)0x0;
  this->spirvType = (TSpirvType *)0x0;
  if (vs < 0) {
    __assert_fail("vs >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                  ,0x627,
                  "glslang::TType::TType(TBasicType, TStorageQualifier, TPrecisionQualifier, int, int, int, bool)"
                 );
  }
  if (mc < 0) {
    __assert_fail("mc >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                  ,0x628,
                  "glslang::TType::TType(TBasicType, TStorageQualifier, TPrecisionQualifier, int, int, int, bool)"
                 );
  }
  if (mr < 0) {
    __assert_fail("mr >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                  ,0x629,
                  "glslang::TType::TType(TBasicType, TStorageQualifier, TPrecisionQualifier, int, int, int, bool)"
                 );
  }
  TSampler::clear(&this->sampler);
  TQualifier::clear(&this->qualifier);
  *(ulong *)&(this->qualifier).field_0x8 =
       *(ulong *)&(this->qualifier).field_0x8 & 0xffffffffffffff80 | (ulong)q & 0x7f;
  *(ulong *)&(this->qualifier).field_0x8 =
       *(ulong *)&(this->qualifier).field_0x8 & 0xfffffffff1ffffff | ((ulong)p & 7) << 0x19;
  local_39 = p < 4;
  if (local_39) {
    uVar1 = (*this->_vptr_TType[0x1c])();
    bVar2 = false;
    if ((uVar1 & 1) != 0) {
      bVar2 = (*(uint *)&this->field_0x8 >> 8 & 0xf) != 0;
    }
    if (bVar2) {
      __assert_fail("!(isMatrix() && vectorSize != 0)",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x630,
                    "glslang::TType::TType(TBasicType, TStorageQualifier, TPrecisionQualifier, int, int, int, bool)"
                   );
    }
    return;
  }
  __assert_fail("p >= EpqNone && p <= EpqHigh",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                ,0x62f,
                "glslang::TType::TType(TBasicType, TStorageQualifier, TPrecisionQualifier, int, int, int, bool)"
               );
}

Assistant:

TType(TBasicType t, TStorageQualifier q, TPrecisionQualifier p, int vs = 1, int mc = 0, int mr = 0,
          bool isVector = false) :
                            basicType(t), vectorSize(static_cast<uint32_t>(vs) & 0b1111), matrixCols(static_cast<uint32_t>(mc) & 0b1111), matrixRows(static_cast<uint32_t>(mr) & 0b1111), vector1(isVector && vs == 1), coopmatNV(false), coopmatKHR(false), coopmatKHRuse(0), coopmatKHRUseValid(false), coopvecNV(false),
                            arraySizes(nullptr), structure(nullptr), fieldName(nullptr), typeName(nullptr), typeParameters(nullptr),
                            spirvType(nullptr)
                            {
                                assert(vs >= 0);
                                assert(mc >= 0);
                                assert(mr >= 0);

                                sampler.clear();
                                qualifier.clear();
                                qualifier.storage = q;
                                qualifier.precision = p;
                                assert(p >= EpqNone && p <= EpqHigh);
                                assert(!(isMatrix() && vectorSize != 0));  // prevent vectorSize != 0 on matrices
                            }